

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O0

int EmitRescaledYUV(VP8Io *io,WebPDecParams *p)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  int num_lines_out;
  WebPRescaler *scaler;
  int uv_mb_h;
  int mb_h;
  int in_stack_ffffffffffffffcc;
  WebPRescaler *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd8;
  int stride;
  uint8_t *ptr;
  
  ptr = *(uint8_t **)(in_RSI + 0x30);
  stride = 0;
  iVar1 = WebPIsAlphaMode(MODE_RGB);
  if ((iVar1 != 0) && (*(long *)(in_RDI + 0x98) != 0)) {
    WebPMultRows(ptr,stride,(uint8_t *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,0,0,
                 (int)in_RSI);
  }
  iVar1 = Rescale(ptr,stride,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  Rescale(ptr,iVar1,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  Rescale(ptr,iVar1,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return iVar1;
}

Assistant:

static int EmitRescaledYUV(const VP8Io* const io, WebPDecParams* const p) {
  const int mb_h = io->mb_h;
  const int uv_mb_h = (mb_h + 1) >> 1;
  WebPRescaler* const scaler = p->scaler_y;
  int num_lines_out = 0;
  if (WebPIsAlphaMode(p->output->colorspace) && io->a != NULL) {
    // Before rescaling, we premultiply the luma directly into the io->y
    // internal buffer. This is OK since these samples are not used for
    // intra-prediction (the top samples are saved in cache_y_/u_/v_).
    // But we need to cast the const away, though.
    WebPMultRows((uint8_t*)io->y, io->y_stride,
                 io->a, io->width, io->mb_w, mb_h, 0);
  }
  num_lines_out = Rescale(io->y, io->y_stride, mb_h, scaler);
  Rescale(io->u, io->uv_stride, uv_mb_h, p->scaler_u);
  Rescale(io->v, io->uv_stride, uv_mb_h, p->scaler_v);
  return num_lines_out;
}